

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_01;
  cmValue rhs;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_51;
  string local_50;
  
  this_01 = cmTarget::GetMakefile(this->Target->Target);
  bVar1 = cmMakefile::PlatformIsAppleEmbedded(this_01);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"XCODE",&local_51);
    bVar1 = cmMakefile::IsOn(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"XCODE_VERSION",&local_51);
      rhs = cmMakefile::GetDefinition(this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (rhs.Value != (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"6",&local_51);
        bVar1 = cmSystemTools::VersionCompareGreater(&local_50,rhs.Value);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar1) {
          TVar2 = cmGeneratorTarget::GetType(this->Target);
          if (TVar2 < OBJECT_LIBRARY) {
            this_00 = this->Target->Target;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"IOS_INSTALL_COMBINED",&local_51);
            bVar1 = cmTarget::GetPropertyAsBool(this_00,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar1) {
              poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
              std::operator<<(poVar3,"include(CMakeIOSInstallCombined)\n");
              poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
              poVar3 = std::operator<<(poVar3,"ios_install_combined(");
              poVar3 = std::operator<<(poVar3,"\"");
              psVar4 = cmTarget::GetName_abi_cxx11_(this->Target->Target);
              poVar3 = std::operator<<(poVar3,(string *)psVar4);
              poVar3 = std::operator<<(poVar3,"\" ");
              poVar3 = std::operator<<(poVar3,"\"");
              poVar3 = std::operator<<(poVar3,(string *)toDestDirPath);
              std::operator<<(poVar3,"\")\n");
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleEmbedded() || !mf->IsOn("XCODE")) {
    return;
  }

  cmValue xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", *xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}